

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void __thiscall vm_rcdesc::init_ret(vm_rcdesc *this,char *name)

{
  uchar *puVar1;
  
  this->name = name;
  (this->bifptr).typ = VM_NIL;
  (this->self).typ = VM_NIL;
  this->method_idx = 0;
  this->argc = 0;
  this->argp = (vm_val_t *)0x0;
  if (pc_ptr_ == (uchar **)0x0) {
    puVar1 = (uchar *)0x0;
  }
  else {
    puVar1 = *pc_ptr_;
  }
  this->caller_addr = puVar1;
  return;
}

Assistant:

void vm_rcdesc::init_ret(VMG_ const char *name)
{
    this->name = name;
    bifptr.set_nil();
    self.set_nil();
    method_idx = 0;
    argc = 0;
    argp = 0;
    caller_addr = G_interpreter->get_last_pc();
}